

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  pointer *__return_storage_ptr__;
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  pointer pcVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  bool local_4d1;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_4c8;
  const_iterator local_4c0;
  allocator local_4b1;
  string local_4b0;
  undefined1 local_490 [8];
  cmListFileArgument prj;
  cmListFileFunction project;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_400;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_3f8;
  iterator i_2;
  bool hasProject;
  iterator iStack_3e8;
  _Self local_3e0;
  undefined1 local_3d8 [8];
  string name;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_3b0;
  iterator i_1;
  allocator local_391;
  value_type local_390;
  _Base_ptr local_370;
  undefined1 local_368;
  allocator local_359;
  value_type local_358;
  _Base_ptr local_338;
  undefined1 local_330;
  allocator local_321;
  value_type local_320;
  _Base_ptr local_300;
  undefined1 local_2f8;
  allocator local_2e9;
  value_type local_2e8;
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  allocator local_2b1;
  value_type local_2b0;
  _Base_ptr local_290;
  undefined1 local_288;
  allocator local_279;
  value_type local_278;
  _Base_ptr local_258;
  undefined1 local_250;
  allocator local_241;
  value_type local_240;
  _Base_ptr local_220;
  undefined1 local_218;
  allocator local_209;
  value_type local_208;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  allocator local_1d1;
  value_type local_1d0;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_161;
  value_type local_160;
  undefined1 local_140 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  undefined1 local_108 [7];
  bool isProblem;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_e8;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_e0;
  iterator i;
  undefined1 local_d0 [7];
  bool hasVersion;
  cmListFileParser parser;
  bool parseError;
  allocator local_51;
  string local_50;
  cmMakefile *local_30;
  cmMakefile *mf_local;
  char *pcStack_20;
  bool topLevel_local;
  char *filename_local;
  cmListFile *this_local;
  
  local_30 = mf;
  mf_local._7_1_ = topLevel;
  pcStack_20 = filename;
  filename_local = (char *)this;
  bVar2 = cmsys::SystemTools::FileExists(filename);
  pcVar1 = pcStack_20;
  parser.Separation._3_1_ = SeparationOkay >> 0x18;
  local_4d1 = true;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
    parser.Separation._3_1_ = 1;
    local_4d1 = cmsys::SystemTools::FileIsDirectory(&local_50);
  }
  if ((parser.Separation._3_1_ & 1) != SeparationOkay >> 0x18) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  if (local_4d1 == false) {
    parser.Separation._2_1_ = SeparationOkay >> 0x10;
    cmListFileParser::cmListFileParser((cmListFileParser *)local_d0,this,local_30,pcStack_20);
    bVar2 = cmListFileParser::ParseFile((cmListFileParser *)local_d0);
    parser.Separation._2_1_ = (bVar2 ^ 0xff) & 1;
    cmListFileParser::~cmListFileParser((cmListFileParser *)local_d0);
    if ((mf_local._7_1_ & 1) != 0) {
      i._M_current._7_1_ = 0;
      local_e0._M_current =
           (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     (&this->Functions);
      while( true ) {
        local_e8._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       (&this->Functions);
        bVar2 = __gnu_cxx::operator!=(&local_e0,&local_e8);
        if (!bVar2) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator->(&local_e0);
        cmsys::SystemTools::LowerCase((string *)local_108,(string *)pcVar4);
        bVar2 = std::operator==((string *)local_108,"cmake_minimum_required");
        std::__cxx11::string::~string((string *)local_108);
        if (bVar2) {
          i._M_current._7_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&local_e0);
      }
      if ((i._M_current._7_1_ & 1) == 0) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar3 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          (&this->Functions);
        if (sVar3 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_140);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_160,"project",&local_161);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_160);
          local_178 = (_Base_ptr)pVar5.first._M_node;
          local_170 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_198,"set",&local_199);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_198);
          local_1b0 = (_Base_ptr)pVar5.first._M_node;
          local_1a8 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1d0,"if",&local_1d1);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_1d0);
          local_1e8 = (_Base_ptr)pVar5.first._M_node;
          local_1e0 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_208,"endif",&local_209);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_208);
          local_220 = (_Base_ptr)pVar5.first._M_node;
          local_218 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_240,"else",&local_241);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_240);
          local_258 = (_Base_ptr)pVar5.first._M_node;
          local_250 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_278,"elseif",&local_279);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_278);
          local_290 = (_Base_ptr)pVar5.first._M_node;
          local_288 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator((allocator<char> *)&local_279);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2b0,"add_executable",&local_2b1);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_2b0);
          local_2c8 = (_Base_ptr)pVar5.first._M_node;
          local_2c0 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_2b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2e8,"add_library",&local_2e9);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_2e8);
          local_300 = (_Base_ptr)pVar5.first._M_node;
          local_2f8 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_320,"target_link_libraries",&local_321);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_320);
          local_338 = (_Base_ptr)pVar5.first._M_node;
          local_330 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator((allocator<char> *)&local_321);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_358,"option",&local_359);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_358);
          local_370 = (_Base_ptr)pVar5.first._M_node;
          local_368 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator((allocator<char> *)&local_359);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_390,"message",&local_391);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,&local_390);
          i_1._M_current = (cmListFileFunction *)pVar5.first._M_node;
          std::__cxx11::string::~string((string *)&local_390);
          std::allocator<char>::~allocator((allocator<char> *)&local_391);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          local_3b0._M_current =
               (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         (&this->Functions);
          while( true ) {
            name.field_2._8_8_ =
                 std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                           (&this->Functions);
            bVar2 = __gnu_cxx::operator!=
                              (&local_3b0,
                               (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                *)((long)&name.field_2 + 8));
            if (!bVar2) break;
            pcVar4 = __gnu_cxx::
                     __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                     ::operator->(&local_3b0);
            cmsys::SystemTools::LowerCase((string *)local_3d8,(string *)pcVar4);
            local_3e0._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_140,(key_type *)local_3d8);
            iStack_3e8 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_140);
            bVar2 = std::operator==(&local_3e0,&stack0xfffffffffffffc18);
            if (bVar2) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              i_2._M_current._4_4_ = 5;
            }
            else {
              i_2._M_current._4_4_ = 0;
            }
            std::__cxx11::string::~string((string *)local_3d8);
            if (i_2._M_current._4_4_ != 0) break;
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&local_3b0);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          cmMakefile::SetCheckCMP0000(local_30,true);
          cmMakefile::SetPolicyVersion(local_30,"2.4");
        }
      }
    }
    if ((mf_local._7_1_ & 1) != 0) {
      i_2._M_current._3_1_ = 0;
      local_3f8._M_current =
           (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     (&this->Functions);
      while( true ) {
        local_400._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       (&this->Functions);
        bVar2 = __gnu_cxx::operator!=(&local_3f8,&local_400);
        if (!bVar2) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator->(&local_3f8);
        __return_storage_ptr__ =
             &project.Arguments.
              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        cmsys::SystemTools::LowerCase((string *)__return_storage_ptr__,(string *)pcVar4);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__return_storage_ptr__,"project");
        std::__cxx11::string::~string
                  ((string *)
                   &project.Arguments.
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          i_2._M_current._3_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&local_3f8);
      }
      if ((i_2._M_current._3_1_ & 1) == 0) {
        cmListFileFunction::cmListFileFunction((cmListFileFunction *)&prj.Line);
        std::__cxx11::string::operator=((string *)&prj.Line,"PROJECT");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4b0,"Project",&local_4b1);
        cmListFileArgument::cmListFileArgument
                  ((cmListFileArgument *)local_490,&local_4b0,Unquoted,0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                   &project.super_cmCommandContext.Line,(value_type *)local_490);
        local_4c8._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       (&this->Functions);
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_4c0,&local_4c8);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  (&this->Functions,local_4c0,(value_type *)&prj.Line);
        cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_490);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&prj.Line);
      }
    }
    if ((parser.Separation._2_1_ & 1) == SeparationOkay >> 0x10) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}